

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitIf
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,If *curr)

{
  StackInst *in_RAX;
  StackInst *local_28;
  
  local_28 = in_RAX;
  StackIRGenerator::emit((StackIRGenerator *)this,(Expression *)curr);
  visitPossibleBlockContents(this,curr->ifTrue);
  if (curr->ifFalse != (Expression *)0x0) {
    local_28 = StackIRGenerator::makeStackInst((StackIRGenerator *)this,IfElse,(Expression *)curr);
    std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::emplace_back<wasm::StackInst*>
              ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)(this + 2),&local_28);
    visitPossibleBlockContents(this,curr->ifFalse);
  }
  StackIRGenerator::emitScopeEnd((StackIRGenerator *)this,(Expression *)curr);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id == 1) {
    if (curr->ifFalse == (Expression *)0x0) {
      __assert_fail("curr->ifFalse",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-stack.h"
                    ,0x18c,
                    "void wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitIf(If *) [SubType = wasm::StackIRGenerator]"
                   );
    }
    StackIRGenerator::emitUnreachable((StackIRGenerator *)this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitIf(If* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->ifTrue);

  if (curr->ifFalse) {
    emitIfElse(curr);
    visitPossibleBlockContents(curr->ifFalse);
  }

  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    // We already handled the case of the condition being unreachable in
    // `visit`.  Otherwise, we may still be unreachable, if we are an if-else
    // with both sides unreachable. Just like with blocks, we emit an extra
    // `unreachable` to work around potential type mismatches.
    assert(curr->ifFalse);
    emitUnreachable();
  }
}